

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

string * __thiscall
vkt::shaderexecutor::intervalToString<tcu::Matrix<float,2,4>>
          (string *__return_storage_ptr__,shaderexecutor *this,FloatFormat *fmt,IVal *ival)

{
  ostringstream oss;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  printIVal<tcu::Matrix<float,2,4>>((FloatFormat *)this,(IVal *)fmt,(ostream *)aoStack_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

string intervalToString (const FloatFormat& fmt, const typename Traits<T>::IVal& ival)
{
	ostringstream oss;
	printIVal<T>(fmt, ival, oss);
	return oss.str();
}